

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypt.cpp
# Opt level: O0

RPCHelpMan * wallet::encryptwallet(void)

{
  initializer_list<RPCArg> __l;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_fffffffffffff808;
  RPCArg *this;
  anon_class_1_0_00000001 *in_stack_fffffffffffff810;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff818;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff820;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff838;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff840;
  allocator<char> *in_stack_fffffffffffff848;
  iterator in_stack_fffffffffffff850;
  undefined1 *puVar2;
  RPCArgOptions *in_stack_fffffffffffff858;
  string *in_stack_fffffffffffff860;
  Fallback *in_stack_fffffffffffff868;
  undefined1 skip_type_check;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_fffffffffffff870;
  string *in_stack_fffffffffffff878;
  RPCArg *in_stack_fffffffffffff880;
  RPCResults *in_stack_fffffffffffff888;
  RPCResult *in_stack_fffffffffffff890;
  RPCExamples *in_stack_fffffffffffff950;
  undefined8 in_stack_fffffffffffff958;
  undefined8 in_stack_fffffffffffff960;
  string *in_stack_fffffffffffff968;
  pointer in_stack_fffffffffffff970;
  pointer this_00;
  allocator<char> local_66a;
  allocator<char> local_669 [32];
  allocator<char> local_649 [8];
  allocator<char> local_641 [31];
  allocator<char> local_622;
  allocator<char> local_621 [145];
  RPCMethodImpl *in_stack_fffffffffffffa70;
  undefined1 local_150 [264];
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff858,(char *)in_stack_fffffffffffff850,in_stack_fffffffffffff848);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff858,(char *)in_stack_fffffffffffff850,in_stack_fffffffffffff848);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff858,(char *)in_stack_fffffffffffff850,in_stack_fffffffffffff848);
  local_649[1] = (allocator<char>)0x0;
  local_649[2] = (allocator<char>)0x0;
  local_649[3] = (allocator<char>)0x0;
  local_649[4] = (allocator<char>)0x0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff818,(Optional *)in_stack_fffffffffffff810);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff858,(char *)in_stack_fffffffffffff850,in_stack_fffffffffffff848);
  std::__cxx11::string::string(in_stack_fffffffffffff820);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff808);
  RPCArg::RPCArg(in_stack_fffffffffffff880,in_stack_fffffffffffff878,
                 (Type)((ulong)in_stack_fffffffffffff870 >> 0x20),in_stack_fffffffffffff868,
                 in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  skip_type_check = (undefined1)((ulong)in_stack_fffffffffffff868 >> 0x38);
  std::allocator<RPCArg>::allocator(in_stack_fffffffffffff808);
  __l._M_len = (size_type)in_stack_fffffffffffff858;
  __l._M_array = in_stack_fffffffffffff850;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff848,__l,
             (allocator_type *)in_stack_fffffffffffff840);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff858,(char *)in_stack_fffffffffffff850,in_stack_fffffffffffff848);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff858,(char *)in_stack_fffffffffffff850,in_stack_fffffffffffff848);
  this_00 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff808);
  RPCResult::RPCResult
            (in_stack_fffffffffffff890,(Type)((ulong)in_stack_fffffffffffff888 >> 0x20),
             &in_stack_fffffffffffff880->m_names,in_stack_fffffffffffff878,in_stack_fffffffffffff870
             ,(bool)skip_type_check);
  RPCResults::RPCResults(in_stack_fffffffffffff888,(RPCResult *)in_stack_fffffffffffff880);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff858,(char *)in_stack_fffffffffffff850,in_stack_fffffffffffff848);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff858,(char *)in_stack_fffffffffffff850,in_stack_fffffffffffff848);
  HelpExampleCli(in_stack_fffffffffffff840,in_stack_fffffffffffff838);
  std::operator+((char *)in_stack_fffffffffffff820,in_stack_fffffffffffff818);
  std::operator+(in_stack_fffffffffffff820,(char *)in_stack_fffffffffffff818);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff858,(char *)in_stack_fffffffffffff850,in_stack_fffffffffffff848);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff858,(char *)in_stack_fffffffffffff850,in_stack_fffffffffffff848);
  HelpExampleCli(in_stack_fffffffffffff840,in_stack_fffffffffffff838);
  std::operator+(in_stack_fffffffffffff840,in_stack_fffffffffffff838);
  std::operator+(in_stack_fffffffffffff820,(char *)in_stack_fffffffffffff818);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff858,(char *)in_stack_fffffffffffff850,in_stack_fffffffffffff848);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff858,(char *)in_stack_fffffffffffff850,in_stack_fffffffffffff848);
  HelpExampleCli(in_stack_fffffffffffff840,in_stack_fffffffffffff838);
  std::operator+(in_stack_fffffffffffff840,in_stack_fffffffffffff838);
  std::operator+(in_stack_fffffffffffff820,(char *)in_stack_fffffffffffff818);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff858,(char *)in_stack_fffffffffffff850,in_stack_fffffffffffff848);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff858,(char *)in_stack_fffffffffffff850,in_stack_fffffffffffff848);
  HelpExampleCli(in_stack_fffffffffffff840,in_stack_fffffffffffff838);
  std::operator+(in_stack_fffffffffffff840,in_stack_fffffffffffff838);
  std::operator+(in_stack_fffffffffffff820,(char *)in_stack_fffffffffffff818);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff858,(char *)in_stack_fffffffffffff850,in_stack_fffffffffffff848);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff858,(char *)in_stack_fffffffffffff850,in_stack_fffffffffffff848);
  HelpExampleRpc(in_stack_fffffffffffff840,in_stack_fffffffffffff838);
  std::operator+(in_stack_fffffffffffff840,in_stack_fffffffffffff838);
  RPCExamples::RPCExamples((RPCExamples *)in_stack_fffffffffffff808,(string *)0x180c0c8);
  this = (RPCArg *)&stack0xfffffffffffff948;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<wallet::encryptwallet()::__0,void>
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)
             in_stack_fffffffffffff818,in_stack_fffffffffffff810);
  RPCHelpMan::RPCHelpMan
            ((RPCHelpMan *)this_00,&in_stack_fffffffffffff970->m_names,in_stack_fffffffffffff968,
             (vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff960,
             (RPCResults *)in_stack_fffffffffffff958,in_stack_fffffffffffff950,
             in_stack_fffffffffffffa70);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff96e);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff96f);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff970);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff971);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff972);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff973);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff974);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff975);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff976);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff977);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult((RPCResult *)this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff818);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_66a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_669);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff818);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  puVar2 = local_150;
  puVar1 = local_48;
  do {
    puVar1 = puVar1 + -0x108;
    RPCArg::~RPCArg(this);
  } while (puVar1 != puVar2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_649);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_641);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_622);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_621);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan encryptwallet()
{
    return RPCHelpMan{"encryptwallet",
                "\nEncrypts the wallet with 'passphrase'. This is for first time encryption.\n"
                "After this, any calls that interact with private keys such as sending or signing \n"
                "will require the passphrase to be set prior the making these calls.\n"
                "Use the walletpassphrase call for this, and then walletlock call.\n"
                "If the wallet is already encrypted, use the walletpassphrasechange call.\n"
                "** IMPORTANT **\n"
                "For security reasons, the encryption process will generate a new HD seed, resulting\n"
                "in the creation of a fresh set of active descriptors. Therefore, it is crucial to\n"
                "securely back up the newly generated wallet file using the backupwallet RPC.\n",
                {
                    {"passphrase", RPCArg::Type::STR, RPCArg::Optional::NO, "The pass phrase to encrypt the wallet with. It must be at least 1 character, but should be long."},
                },
                RPCResult{RPCResult::Type::STR, "", "A string with further instructions"},
                RPCExamples{
            "\nEncrypt your wallet\n"
            + HelpExampleCli("encryptwallet", "\"my pass phrase\"") +
            "\nNow set the passphrase to use the wallet, such as for signing or sending bitcoin\n"
            + HelpExampleCli("walletpassphrase", "\"my pass phrase\"") +
            "\nNow we can do something like sign\n"
            + HelpExampleCli("signmessage", "\"address\" \"test message\"") +
            "\nNow lock the wallet again by removing the passphrase\n"
            + HelpExampleCli("walletlock", "") +
            "\nAs a JSON-RPC call\n"
            + HelpExampleRpc("encryptwallet", "\"my pass phrase\"")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    std::shared_ptr<CWallet> const pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    if (pwallet->IsWalletFlagSet(WALLET_FLAG_DISABLE_PRIVATE_KEYS)) {
        throw JSONRPCError(RPC_WALLET_ENCRYPTION_FAILED, "Error: wallet does not contain private keys, nothing to encrypt.");
    }

    if (pwallet->IsCrypted()) {
        throw JSONRPCError(RPC_WALLET_WRONG_ENC_STATE, "Error: running with an encrypted wallet, but encryptwallet was called.");
    }

    if (pwallet->IsScanningWithPassphrase()) {
        throw JSONRPCError(RPC_WALLET_ERROR, "Error: the wallet is currently being used to rescan the blockchain for related transactions. Please call `abortrescan` before encrypting the wallet.");
    }

    LOCK2(pwallet->m_relock_mutex, pwallet->cs_wallet);

    SecureString strWalletPass;
    strWalletPass.reserve(100);
    strWalletPass = std::string_view{request.params[0].get_str()};

    if (strWalletPass.empty()) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, "passphrase cannot be empty");
    }

    if (!pwallet->EncryptWallet(strWalletPass)) {
        throw JSONRPCError(RPC_WALLET_ENCRYPTION_FAILED, "Error: Failed to encrypt the wallet.");
    }

    return "wallet encrypted; The keypool has been flushed and a new HD seed was generated. You need to make a new backup with the backupwallet RPC.";
},
    };
}